

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

char * __thiscall CServer::GetMapName(CServer *this)

{
  char cVar1;
  int iVar2;
  char *str;
  char *str_00;
  long lVar3;
  
  str = this->m_pConfig->m_SvMap;
  iVar2 = str_length(str);
  if (1 < iVar2) {
    lVar3 = 0;
    do {
      cVar1 = this->m_pConfig->m_SvMap[lVar3];
      str_00 = this->m_pConfig->m_SvMap;
      if ((cVar1 == '/') || (cVar1 == '\\')) {
        str = str_00 + lVar3 + 1;
      }
      lVar3 = lVar3 + 1;
      iVar2 = str_length(str_00);
    } while (lVar3 < iVar2 + -1);
  }
  return str;
}

Assistant:

const char *CServer::GetMapName()
{
	// get the name of the map without his path
	char *pMapShortName = &Config()->m_SvMap[0];
	for(int i = 0; i < str_length(Config()->m_SvMap)-1; i++)
	{
		if(Config()->m_SvMap[i] == '/' || Config()->m_SvMap[i] == '\\')
			pMapShortName = &Config()->m_SvMap[i+1];
	}
	return pMapShortName;
}